

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O1

int file_stdio_fungetc(ALLEGRO_FILE *f,int c)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  
  puVar2 = (undefined8 *)al_get_file_userdata(f);
  iVar1 = ungetc(c,(FILE *)*puVar2);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    *(int *)(puVar2 + 1) = *piVar3;
    al_set_errno(*piVar3);
  }
  return iVar1;
}

Assistant:

static int file_stdio_fungetc(ALLEGRO_FILE *f, int c)
{
   USERDATA *userdata = get_userdata(f);
   int rc;

   rc = ungetc(c, userdata->fp);
   if (rc == EOF) {
      userdata->errnum = errno;
      al_set_errno(errno);
   }

   return rc;
}